

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O0

void __thiscall dlib::text_field::text_field(text_field *this,drawable_window *w)

{
  int iVar1;
  int iVar2;
  void *event_handler_;
  element_type *peVar3;
  undefined4 extraout_var;
  pointer ptVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  popup_menu *milliseconds;
  popup_menu *new_rect;
  undefined8 *in_RDI;
  pointer in_stack_fffffffffffffb88;
  menu_item_text *in_stack_fffffffffffffb90;
  menu_item_text *this_00;
  drawable_window *in_stack_fffffffffffffb98;
  drawable *in_stack_fffffffffffffba0;
  text_field *in_stack_fffffffffffffba8;
  timer<dlib::text_field> *in_stack_fffffffffffffbb0;
  popup_menu_region *this_01;
  drawable_window *in_stack_fffffffffffffbb8;
  popup_menu_region *in_stack_fffffffffffffbc0;
  timer<dlib::text_field> *this_02;
  text_field *this_03;
  unichar hk;
  text_field *object;
  string *str;
  menu_item_text *this_04;
  undefined1 local_341 [137];
  undefined8 local_2b8;
  code *local_2b0;
  undefined8 local_2a8;
  undefined1 local_299 [137];
  code *local_210;
  undefined8 local_208;
  undefined1 local_1f9 [137];
  code *local_170;
  undefined8 local_168;
  undefined1 local_159 [97];
  menu_item_text *in_stack_ffffffffffffff08;
  popup_menu *in_stack_ffffffffffffff10;
  allocator local_b9;
  menu_item_separator *in_stack_ffffffffffffff48;
  popup_menu *in_stack_ffffffffffffff50;
  
  drawable::drawable(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                     (unsigned_long)in_stack_fffffffffffffb90);
  *in_RDI = &PTR__text_field_0055c410;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_fffffffffffffbb0);
  rgb_pixel::rgb_pixel((rgb_pixel *)(in_RDI + 0x14),'\0','\0','\0');
  rgb_pixel::rgb_pixel((rgb_pixel *)((long)in_RDI + 0xa3),0xff,0xff,0xff);
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  *(undefined1 *)(in_RDI + 0x17) = 0;
  *(undefined1 *)((long)in_RDI + 0xb9) = 0;
  *(undefined1 *)((long)in_RDI + 0xba) = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0xffffffffffffffff;
  in_RDI[0x1c] = 0xffffffffffffffff;
  any_function<void_(),_void,_0UL>::any_function((any_function<void_(),_void,_0UL> *)0x457bce);
  any_function<void_(),_void,_0UL>::any_function((any_function<void_(),_void,_0UL> *)0x457bec);
  this_04 = (menu_item_text *)(in_RDI + 0x1f);
  any_function<void_(),_void,_0UL>::any_function((any_function<void_(),_void,_0UL> *)0x457c0a);
  object = (text_field *)(in_RDI + 0x20);
  std::unique_ptr<dlib::text_field_style,std::default_delete<dlib::text_field_style>>::
  unique_ptr<std::default_delete<dlib::text_field_style>,void>
            ((unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_> *)
             in_stack_fffffffffffffb90);
  str = (string *)(in_RDI + 0x21);
  timer<dlib::text_field>::timer
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(af_type)in_stack_fffffffffffffb98)
  ;
  popup_menu_region::popup_menu_region(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  hk = (unichar)((ulong)(in_RDI + 0x20) >> 0x20);
  event_handler_ = operator_new(8);
  text_field_style_default::text_field_style_default
            ((text_field_style_default *)in_stack_fffffffffffffb90);
  std::unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>::reset
            ((unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_> *)
             in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  peVar3 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x457d08);
  iVar1 = (*peVar3->_vptr_font[4])();
  ptVar4 = std::unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>::
           operator->((unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
                       *)0x457d32);
  peVar3 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffb90);
  iVar2 = (*ptVar4->_vptr_text_field_style[2])(ptVar4,peVar3);
  rectangle::set_bottom
            ((rectangle *)(in_RDI + 1),
             CONCAT44(extraout_var,iVar1) + CONCAT44(extraout_var_00,iVar2) * 2);
  ptVar4 = std::unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>::
           operator->((unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
                       *)0x457daa);
  peVar3 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffb90);
  iVar1 = (*ptVar4->_vptr_text_field_style[2])(ptVar4,peVar3);
  rectangle::set_right((rectangle *)(in_RDI + 1),CONCAT44(extraout_var_01,iVar1) * 2);
  ptVar4 = std::unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>::
           operator->((unique_ptr<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
                       *)0x457e0a);
  peVar3 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffb90);
  iVar1 = (*ptVar4->_vptr_text_field_style[2])(ptVar4,peVar3);
  in_RDI[0x19] = CONCAT44(extraout_var_02,iVar1);
  popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff48,"Cut",&local_b9);
  menu_item_text::menu_item_text<dlib::text_field>
            (this_04,str,object,(offset_in_text_field_to_subr)event_handler_,hk);
  popup_menu::add_menu_item<dlib::menu_item_text>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  menu_item_text::~menu_item_text(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  this_03 = (text_field *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_159 + 1),"Copy",(allocator *)this_03);
  local_170 = on_copy;
  local_168 = 0;
  menu_item_text::menu_item_text<dlib::text_field>
            (this_04,str,object,(offset_in_text_field_to_subr)event_handler_,hk);
  popup_menu::add_menu_item<dlib::menu_item_text>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  menu_item_text::~menu_item_text(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  this_02 = (timer<dlib::text_field> *)local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1f9 + 1),"Paste",(allocator *)this_02);
  local_210 = on_paste;
  local_208 = 0;
  menu_item_text::menu_item_text<dlib::text_field>
            (this_04,str,object,(offset_in_text_field_to_subr)event_handler_,hk);
  popup_menu::add_menu_item<dlib::menu_item_text>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  menu_item_text::~menu_item_text(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  milliseconds = popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  this_01 = (popup_menu_region *)local_299;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_299 + 1),"Delete",(allocator *)this_01);
  local_2b0 = on_delete_selected;
  local_2a8 = 0;
  menu_item_text::menu_item_text<dlib::text_field>
            (this_04,str,object,(offset_in_text_field_to_subr)event_handler_,hk);
  popup_menu::add_menu_item<dlib::menu_item_text>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  menu_item_text::~menu_item_text(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string((string *)(local_299 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_299);
  new_rect = popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  local_2b8 = 0;
  menu_item_separator::menu_item_separator((menu_item_separator *)in_stack_fffffffffffffb90);
  popup_menu::add_menu_item<dlib::menu_item_separator>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  menu_item_separator::~menu_item_separator((menu_item_separator *)0x4581e7);
  popup_menu_region::menu((popup_menu_region *)(in_RDI + 0x39));
  this_00 = (menu_item_text *)local_341;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_341 + 1),"Select All",(allocator *)this_00);
  menu_item_text::menu_item_text<dlib::text_field>
            (this_04,str,object,(offset_in_text_field_to_subr)event_handler_,hk);
  popup_menu::add_menu_item<dlib::menu_item_text>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  menu_item_text::~menu_item_text(this_00);
  std::__cxx11::string::~string((string *)(local_341 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_341);
  get_text_rect(this_03);
  popup_menu_region::set_rect(this_01,(rectangle *)new_rect);
  drawable::enable_events(&object->super_drawable);
  timer<dlib::text_field>::set_delay_time(this_02,(unsigned_long)milliseconds);
  return;
}

Assistant:

text_field(
            drawable_window& w
        ) : 
            drawable(w,MOUSE_CLICK | KEYBOARD_EVENTS | MOUSE_MOVE | STRING_PUT),
            text_color_(0,0,0),
            bg_color_(255,255,255),
            text_width(0),
            text_pos(0),
            recent_movement(false),
            has_focus(false),
            cursor_visible(false),
            cursor_pos(0),
            highlight_start(0),
            highlight_end(-1),
            shift_pos(-1),
            t(*this,&text_field::timer_action),
            right_click_menu(w)
        {
            style.reset(new text_field_style_default());
            rect.set_bottom(mfont->height()+ (style->get_padding(*mfont))*2);
            rect.set_right((style->get_padding(*mfont))*2);
            cursor_x = style->get_padding(*mfont);

            right_click_menu.menu().add_menu_item(menu_item_text("Cut",*this,&text_field::on_cut,'t'));
            right_click_menu.menu().add_menu_item(menu_item_text("Copy",*this,&text_field::on_copy,'C'));
            right_click_menu.menu().add_menu_item(menu_item_text("Paste",*this,&text_field::on_paste,'P'));
            right_click_menu.menu().add_menu_item(menu_item_text("Delete",*this,&text_field::on_delete_selected,'D'));
            right_click_menu.menu().add_menu_item(menu_item_separator());
            right_click_menu.menu().add_menu_item(menu_item_text("Select All",*this,&text_field::on_select_all,'A'));

            right_click_menu.set_rect(get_text_rect());
            enable_events();

            t.set_delay_time(500);
        }